

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_bpf_process_pcm_frames
                    (ma_bpf *pBPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ma_format mVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ma_result mVar16;
  ma_uint32 mVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong in_RCX;
  void *in_RDX;
  long lVar22;
  void *in_RSI;
  ma_format *in_RDI;
  float fVar23;
  ma_int16 *pFramesInS16;
  ma_int16 *pFramesOutS16;
  float *pFramesInF32;
  float *pFramesOutF32;
  ma_uint32 iFrame;
  ma_uint32 ibpf2;
  ma_result result;
  float y;
  float x;
  float r2;
  float r1;
  float a2;
  float a1;
  float b2;
  float b1;
  float b0;
  ma_uint32 channels;
  ma_uint32 c;
  ma_int32 y_1;
  ma_int32 x_1;
  ma_int32 r2_1;
  ma_int32 r1_1;
  ma_int32 a2_1;
  ma_int32 a1_1;
  ma_int32 b2_1;
  ma_int32 b1_1;
  ma_int32 b0_1;
  ma_uint32 channels_1;
  ma_uint32 c_1;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined2 uVar24;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int iVar25;
  ma_bpf2 *in_stack_fffffffffffffe88;
  void *__dest;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  uint local_134;
  ma_format local_130;
  ma_result local_104;
  uint local_7c;
  uint local_1c;
  
  if (in_RDI == (ma_format *)0x0) {
    local_104 = MA_INVALID_ARGS;
  }
  else {
    if (in_RSI == in_RDX) {
      for (local_130 = ma_format_unknown; local_130 < in_RDI[2];
          local_130 = local_130 + ma_format_u8) {
        mVar16 = ma_bpf2_process_pcm_frames
                           (in_stack_fffffffffffffe88,
                            (void *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (void *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            0x21963d);
        if (mVar16 != MA_SUCCESS) {
          return mVar16;
        }
      }
    }
    if (in_RSI != in_RDX) {
      if (*in_RDI == ma_format_f32) {
        local_148 = in_RDX;
        local_140 = in_RSI;
        for (local_134 = 0; local_134 < in_RCX; local_134 = local_134 + 1) {
          mVar8 = in_RDI[1];
          mVar17 = ma_get_bytes_per_sample(*in_RDI);
          memcpy(local_140,local_148,(ulong)(mVar17 * mVar8));
          for (local_130 = ma_format_unknown; local_130 < in_RDI[2];
              local_130 = local_130 + ma_format_u8) {
            lVar22 = *(undefined8 *)(in_RDI + 4) + (ulong)local_130 * 0x40;
            uVar9 = *(uint *)(lVar22 + 4);
            fVar1 = *(float *)(lVar22 + 8);
            fVar2 = *(float *)(lVar22 + 0xc);
            fVar3 = *(float *)(lVar22 + 0x10);
            fVar4 = *(float *)(lVar22 + 0x14);
            fVar5 = *(float *)(lVar22 + 0x18);
            for (local_7c = 0; local_7c < uVar9; local_7c = local_7c + 1) {
              fVar6 = *(float *)(*(long *)(lVar22 + 0x28) + (ulong)local_7c * 4);
              fVar7 = *(float *)((long)local_140 + (ulong)local_7c * 4);
              fVar23 = fVar1 * fVar7 + *(float *)(*(long *)(lVar22 + 0x20) + (ulong)local_7c * 4);
              *(float *)((long)local_140 + (ulong)local_7c * 4) = fVar23;
              *(float *)(*(long *)(lVar22 + 0x20) + (ulong)local_7c * 4) =
                   fVar2 * fVar7 + -(fVar4 * fVar23) + fVar6;
              *(float *)(*(long *)(lVar22 + 0x28) + (ulong)local_7c * 4) =
                   fVar3 * fVar7 + -(fVar5 * fVar23);
            }
          }
          local_140 = (void *)((long)local_140 + (ulong)in_RDI[1] * 4);
          local_148 = (void *)((long)local_148 + (ulong)in_RDI[1] * 4);
        }
      }
      else {
        if (*in_RDI != ma_format_s16) {
          return MA_INVALID_OPERATION;
        }
        local_158 = in_RDX;
        local_150 = in_RSI;
        for (local_134 = 0; local_134 < in_RCX; local_134 = local_134 + 1) {
          mVar8 = in_RDI[1];
          __dest = local_150;
          mVar17 = ma_get_bytes_per_sample(*in_RDI);
          memcpy(__dest,local_158,(ulong)(mVar17 * mVar8));
          for (local_130 = ma_format_unknown; local_130 < in_RDI[2];
              local_130 = local_130 + ma_format_u8) {
            lVar22 = *(undefined8 *)(in_RDI + 4) + (ulong)local_130 * 0x40;
            uVar9 = *(uint *)(lVar22 + 4);
            iVar10 = *(int *)(lVar22 + 8);
            iVar11 = *(int *)(lVar22 + 0xc);
            iVar12 = *(int *)(lVar22 + 0x10);
            iVar13 = *(int *)(lVar22 + 0x14);
            iVar14 = *(int *)(lVar22 + 0x18);
            for (local_1c = 0; local_1c < uVar9; local_1c = local_1c + 1) {
              iVar15 = *(int *)(*(long *)(lVar22 + 0x28) + (ulong)local_1c * 4);
              iVar18 = (int)*(short *)((long)local_150 + (ulong)local_1c * 2);
              iVar19 = iVar10 * iVar18 + *(int *)(*(long *)(lVar22 + 0x20) + (ulong)local_1c * 4) >>
                       0xe;
              iVar20 = iVar13 * iVar19;
              iVar21 = iVar14 * iVar19;
              iVar25 = iVar19;
              if (0x7ffe < iVar19) {
                iVar25 = 0x7fff;
              }
              if (iVar25 < -0x8000) {
                uVar24 = 0x8000;
              }
              else {
                if (0x7ffe < iVar19) {
                  iVar19 = 0x7fff;
                }
                uVar24 = (undefined2)iVar19;
              }
              *(undefined2 *)((long)local_150 + (ulong)local_1c * 2) = uVar24;
              *(int *)(*(long *)(lVar22 + 0x20) + (ulong)local_1c * 4) =
                   (iVar11 * iVar18 - iVar20) + iVar15;
              *(int *)(*(long *)(lVar22 + 0x28) + (ulong)local_1c * 4) = iVar12 * iVar18 - iVar21;
            }
          }
          local_150 = (void *)((long)local_150 + (ulong)in_RDI[1] * 2);
          local_158 = (void *)((long)local_158 + (ulong)in_RDI[1] * 2);
        }
      }
    }
    local_104 = MA_SUCCESS;
  }
  return local_104;
}

Assistant:

MA_API ma_result ma_bpf_process_pcm_frames(ma_bpf* pBPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_result result;
    ma_uint32 ibpf2;

    if (pBPF == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Faster path for in-place. */
    if (pFramesOut == pFramesIn) {
        for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
            result = ma_bpf2_process_pcm_frames(&pBPF->pBPF2[ibpf2], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }
    }

    /* Slightly slower path for copying. */
    if (pFramesOut != pFramesIn) {
        ma_uint32 iFrame;

        /*  */ if (pBPF->format == ma_format_f32) {
            /* */ float* pFramesOutF32 = (      float*)pFramesOut;
            const float* pFramesInF32  = (const float*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutF32, pFramesInF32, ma_get_bytes_per_frame(pBPF->format, pBPF->channels));

                for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
                    ma_bpf2_process_pcm_frame_f32(&pBPF->pBPF2[ibpf2], pFramesOutF32, pFramesOutF32);
                }

                pFramesOutF32 += pBPF->channels;
                pFramesInF32  += pBPF->channels;
            }
        } else if (pBPF->format == ma_format_s16) {
            /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
            const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutS16, pFramesInS16, ma_get_bytes_per_frame(pBPF->format, pBPF->channels));

                for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
                    ma_bpf2_process_pcm_frame_s16(&pBPF->pBPF2[ibpf2], pFramesOutS16, pFramesOutS16);
                }

                pFramesOutS16 += pBPF->channels;
                pFramesInS16  += pBPF->channels;
            }
        } else {
            MA_ASSERT(MA_FALSE);
            return MA_INVALID_OPERATION;    /* Should never hit this. */
        }
    }

    return MA_SUCCESS;
}